

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O0

void __thiscall
WriteIncludesBase::add(WriteIncludesBase *this,QString *className,DomCustomWidget *dcw)

{
  initializer_list<QString> args;
  QAnyStringView baseClassName;
  QAnyStringView baseClassName_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  DomCustomWidget *dcw_00;
  QArrayDataPointer<char16_t> *this_00;
  QString *in_RDX;
  WriteIncludesBase *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  CustomWidgetsInfo *cwi;
  char16_t *str_3;
  char16_t *str_4;
  char16_t *str_1;
  char16_t *str_5;
  char16_t *str;
  char16_t *str_2;
  char16_t *str_6;
  char16_t *str_7;
  char16_t *str_8;
  DataPointer *in_stack_fffffffffffffc68;
  DataPointer *dd;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffc70;
  QList<QString> *in_stack_fffffffffffffc78;
  QAnyStringView *in_stack_fffffffffffffc80;
  WriteIncludesBase *this_01;
  QString *in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  long *local_320;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffcf0;
  size_t in_stack_fffffffffffffcf8;
  DomCustomWidget *dcw_01;
  WriteIncludesBase *this_02;
  QArrayDataPointer<char16_t> local_1e8 [2];
  undefined1 local_1b8 [64];
  QArrayDataPointer<char16_t> local_178 [2];
  QArrayDataPointer<char16_t> local_148 [2];
  QArrayDataPointer<char16_t> local_108 [2];
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  long local_68 [12];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1971f1);
  if ((!bVar1) &&
     (bVar1 = QSet<QString>::contains
                        ((QSet<QString> *)in_stack_fffffffffffffc70,
                         (QString *)in_stack_fffffffffffffc68), !bVar1)) {
    QSet<QString>::insert
              ((QSet<QString> *)in_stack_fffffffffffffc88,(QString *)in_stack_fffffffffffffc80);
    dcw_00 = (DomCustomWidget *)Uic::customWidgetsInfo((Uic *)in_RDI[2]);
    if ((add(QString_const&,DomCustomWidget_const*)::treeViewsWithHeaders == '\0') &&
       (iVar3 = __cxa_guard_acquire(&add(QString_const&,DomCustomWidget_const*)::
                                     treeViewsWithHeaders), iVar3 != 0)) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_90,(Data *)0x0,L"QTreeView",9);
      QString::QString((QString *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_a8,(Data *)0x0,L"QTreeWidget",0xb);
      QString::QString((QString *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_c0,(Data *)0x0,L"QTableView",10);
      QString::QString((QString *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_d8,(Data *)0x0,L"QTableWidget",0xc);
      QString::QString((QString *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      in_stack_fffffffffffffcf0.m_data = local_68;
      in_stack_fffffffffffffcf8 = 4;
      args._M_len = (size_type)in_stack_fffffffffffffc88;
      args._M_array = (iterator)in_stack_fffffffffffffc80;
      QList<QString>::QList(in_stack_fffffffffffffc78,args);
      local_320 = &local_8;
      do {
        local_320 = local_320 + -3;
        QString::~QString((QString *)0x197488);
      } while (local_320 != local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc70);
      __cxa_atexit(QList<QString>::~QList,&add::treeViewsWithHeaders,&__dso_handle);
      __cxa_guard_release(&add(QString_const&,DomCustomWidget_const*)::treeViewsWithHeaders);
    }
    bVar1 = CustomWidgetsInfo::extendsOneOf
                      ((CustomWidgetsInfo *)
                       CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                       in_stack_fffffffffffffc88,(QStringList *)in_stack_fffffffffffffc80);
    if (bVar1) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_108,(Data *)0x0,L"QHeaderView",0xb);
      QString::QString((QString *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      add(in_RSI,in_RDX,dcw_00);
      QString::~QString((QString *)0x1975a3);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc70);
    }
    if ((*(byte *)(in_RDI + 3) & 1) == 0) {
      std::data<char_const,9ul>((char (*) [9])"QToolBox");
      QtPrivate::lengthHelperContainer<char,9ul>((char (*) [9])0x197627);
      QAnyStringView::QAnyStringView<char,_true>
                (in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                 (qsizetype)in_stack_fffffffffffffc70);
      baseClassName.m_size = in_stack_fffffffffffffcf8;
      baseClassName.field_0.m_data = in_stack_fffffffffffffcf0.m_data;
      bVar1 = CustomWidgetsInfo::extends
                        ((CustomWidgetsInfo *)
                         CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                         in_stack_fffffffffffffc88,baseClassName);
      if (bVar1) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_148,(Data *)0x0,L"QLayout",7);
        QString::QString((QString *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        add(in_RSI,in_RDX,dcw_00);
        QString::~QString((QString *)0x1976e9);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc70);
      }
    }
    this_01 = in_RSI;
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_178,(Data *)0x0,L"Line",4);
    QString::QString((QString *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    bVar2 = ::operator==((QString *)in_stack_fffffffffffffc70,(QString *)in_stack_fffffffffffffc68);
    QString::~QString((QString *)0x197788);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc70);
    if ((bVar2 & 1) == 0) {
      dd = (DataPointer *)local_1b8;
      dcw_01 = dcw_00;
      this_02 = this_01;
      this_00 = (QArrayDataPointer<char16_t> *)
                std::data<char_const,17ul>((char (*) [17])"QDialogButtonBox");
      QtPrivate::lengthHelperContainer<char,17ul>((char (*) [17])0x1978a0);
      QAnyStringView::QAnyStringView<char,_true>
                ((QAnyStringView *)this_01,(char *)dcw_00,(qsizetype)this_00);
      baseClassName_00.m_size = in_stack_fffffffffffffcf8;
      baseClassName_00.field_0.m_data = in_stack_fffffffffffffcf0.m_data;
      bVar1 = CustomWidgetsInfo::extends
                        ((CustomWidgetsInfo *)CONCAT17(bVar2,in_stack_fffffffffffffc90),
                         (QString *)in_RSI,baseClassName_00);
      if (bVar1) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_1e8,(Data *)0x0,L"QAbstractButton",0xf)
        ;
        QString::QString((QString *)this_00,dd);
        add(this_02,in_RDX,dcw_01);
        QString::~QString((QString *)0x197961);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
      }
      (**(code **)(*in_RDI + 0x118))(in_RDI,this_02,in_RDX);
    }
    else {
      QArrayDataPointer<char16_t>::QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)(local_1b8 + 0x10),(Data *)0x0,L"QFrame",6);
      QString::QString((QString *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      add(this_01,in_RDX,dcw_00);
      QString::~QString((QString *)0x19782a);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc70);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteIncludesBase::add(const QString &className, const DomCustomWidget *dcw)
{
    if (className.isEmpty() || m_knownClasses.contains(className))
        return;

    m_knownClasses.insert(className);

    const CustomWidgetsInfo *cwi = m_uic->customWidgetsInfo();
    static const QStringList treeViewsWithHeaders = {
        QStringLiteral("QTreeView"), QStringLiteral("QTreeWidget"),
        QStringLiteral("QTableView"), QStringLiteral("QTableWidget")
    };
    if (cwi->extendsOneOf(className, treeViewsWithHeaders))
        add(QStringLiteral("QHeaderView"));

    if (!m_laidOut && cwi->extends(className, "QToolBox"))
        add(QStringLiteral("QLayout")); // spacing property of QToolBox)

    if (className == QStringLiteral("Line")) { // ### hmm, deprecate me!
        add(QStringLiteral("QFrame"));
        return;
    }

    if (cwi->extends(className, "QDialogButtonBox"))
        add(QStringLiteral("QAbstractButton")); // for signal "clicked(QAbstractButton*)"

    doAdd(className, dcw);
}